

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.h
# Opt level: O2

bool CommandIsForTitleAndDeveloper(wstring *command_name)

{
  bool bVar1;
  
  bVar1 = std::operator==(command_name,L"JP");
  if (!bVar1) {
    bVar1 = std::operator==(command_name,L"EN");
    if (!bVar1) {
      bVar1 = std::operator==(command_name,L"FR");
      if (!bVar1) {
        bVar1 = std::operator==(command_name,L"GE");
        if (!bVar1) {
          bVar1 = std::operator==(command_name,L"IT");
          if (!bVar1) {
            bVar1 = std::operator==(command_name,L"SP");
            return bVar1;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

inline bool CommandIsForTitleAndDeveloper(const std::wstring& command_name) {
    return command_name == L"JP" ||
           command_name == L"EN" ||
           command_name == L"FR" ||
           command_name == L"GE" ||
           command_name == L"IT" ||
           command_name == L"SP";
}